

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

err_t Node_Constructor(anynode *AnyNode,node *Node,size_t Size,fourcc_t ClassId)

{
  nodecontext *p;
  nodeclass *pnVar1;
  intptr_t iVar2;
  err_t eVar3;
  node *local_30;
  
  if (AnyNode == (anynode *)0x0) {
    __assert_fail("(const void*)(AnyNode)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x35f,"err_t Node_Constructor(anynode *, node *, size_t, fourcc_t)");
  }
  p = (nodecontext *)**(undefined8 **)((long)AnyNode + 8);
  memset(Node,0,Size);
  Node->RefCount = 1;
  pnVar1 = NodeContext_FindClass(p,ClassId);
  eVar3 = -5;
  if ((pnVar1 != (nodeclass *)0x0) && (pnVar1 = LockModules(p,pnVar1), pnVar1 != (nodeclass *)0x0))
  {
    Node->FourCC = ClassId;
    Node->Magic = 0xf0de0a6c;
    Node->VMT = pnVar1 + 1;
    eVar3 = CallCreate(p,Node,pnVar1);
    if (eVar3 == 0) {
      if ((pnVar1->Flags & 1) != 0) {
        if ((pnVar1->Flags & 0x20) == 0) {
          __assert_fail("Class->Flags & CFLAG_OWN_MEMORY",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x372,"err_t Node_Constructor(anynode *, node *, size_t, fourcc_t)");
        }
        local_30 = Node;
        iVar2 = ArrayAddEx(&p->NodeSingleton,(p->NodeSingleton)._Used >> 3,8,&local_30,CmpNode,
                           (void *)0x0,0x40);
        if (iVar2 < 0) {
          Node_Destructor(Node);
          return -2;
        }
        if (Node->Magic != 0xf0de0a6c) {
          __assert_fail("((node*)Node)->Magic==NODE_MAGIC",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                        ,0x88,"void Node_ValidatePtr(anynode *)");
        }
        Node->RefCount = Node->RefCount + 1;
      }
      eVar3 = 0;
    }
    else {
      Node->VMT = (void *)0x0;
      UnlockModules(pnVar1);
    }
  }
  return eVar3;
}

Assistant:

err_t Node_Constructor(anynode* AnyNode, node* Node, size_t Size, fourcc_t ClassId)
{
    err_t Err;
    const nodeclass* Class;
    nodecontext* p = Node_Context(AnyNode);

    memset(Node,0,Size);
    Node->RefCount = 1;

    Class = NodeContext_FindClass(p,ClassId);
    if (Class && (Class = LockModulesWithLock(p,Class)) != NULL)
    {
#ifdef CONFIG_DEBUGCHECKS
        Node->FourCC = ClassId;
        Node->Magic = NODE_MAGIC;
#endif
        Node->VMT = Class+1;

        Err = CallCreate(p,Node,Class);
        if (Err == ERR_NONE)
        {
            if (Class->Flags & CFLAG_SINGLETON)
            {
                assert(Class->Flags & CFLAG_OWN_MEMORY);

                if (!AddSingleton(p,Node))
                {
                    Node_Destructor(Node);
                    return ERR_OUT_OF_MEMORY;
                }

                Node_AddRef(Node);
            }
        }
        else
        {
            Node->VMT = NULL;
            UnlockModules(Class);
        }
    }
    else
        Err = ERR_NOT_SUPPORTED;

    return Err;
}